

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

double __thiscall
ParserProbModelXML::QueryADD
          (ParserProbModelXML *this,xmlNodePtr root_node,xmlNodePtr current_node,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps)

{
  _Rb_tree_color domainI;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  xmlNodePtr pxVar4;
  const_iterator cVar5;
  EParse *pEVar6;
  long *plVar7;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar8;
  long lVar9;
  StateFactorDiscrete *this_00;
  _xmlNode *node;
  char *pcVar10;
  xmlXPathObjectPtr pxVar11;
  ParserProbModelXML *pPVar12;
  undefined8 *puVar13;
  pointer pvVar14;
  _func_int **pp_Var15;
  FactoredDecPOMDPDiscrete *pFVar16;
  pointer pSVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  size_type *psVar19;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *this_01;
  elm_type eVar20;
  ParserProbModelXML *pPVar21;
  ParserProbModelXML *pPVar22;
  ulong uVar23;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *this_02;
  bool bVar24;
  float fVar25;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar26 [16];
  undefined1 extraout_var [56];
  string var_name;
  string xpath_str;
  string value_name;
  string top_name;
  undefined1 local_398 [32];
  ParserProbModelXML *local_378;
  undefined1 local_370 [32];
  double local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  _Base_ptr local_308;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_300;
  undefined1 local_2f8 [32];
  xmlNodePtr local_2d8;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [32];
  undefined1 local_290 [32];
  undefined1 local_270 [32];
  undefined1 local_250 [32];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  string local_130;
  ParserInterface local_110;
  xmlDocPtr local_100 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_60;
  undefined1 auVar27 [64];
  
  pPVar22 = (ParserProbModelXML *)&local_110;
  local_378 = this;
  local_2d8 = root_node;
  local_110._vptr_ParserInterface = (_func_int **)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"TopVariable","");
  pPVar21 = (ParserProbModelXML *)current_node;
  pxVar4 = FindChild(pPVar22,current_node,(string *)&local_110);
  if ((xmlDocPtr *)local_110._vptr_ParserInterface != local_100) {
    pPVar21 = (ParserProbModelXML *)(local_100[0] + 1);
    operator_delete(local_110._vptr_ParserInterface,(ulong)pPVar21);
  }
  if (pxVar4 == (xmlNodePtr)0x0) {
    pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(pEVar6,"Incorrectly specified Tree/ADD (no top variable).");
    __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
  }
  pPVar22 = (ParserProbModelXML *)local_2f8;
  GetVariableName_abi_cxx11_((string *)pPVar22,pPVar21,pxVar4);
  iVar3 = GetVariableTimeslice(pPVar22,pxVar4);
  if (iVar3 == 0) {
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::find(&t0_deps->_M_t,(key_type *)local_2f8);
    if ((_Rb_tree_header *)cVar5._M_node == &(t0_deps->_M_t)._M_impl.super__Rb_tree_header) {
      pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
      std::operator+(&local_348,"Top variable ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8)
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_130._M_dataplus._M_p = (pointer)*plVar7;
      psVar19 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_130._M_dataplus._M_p == psVar19) {
        local_130.field_2._M_allocated_capacity = *psVar19;
        local_130.field_2._8_8_ = plVar7[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar19;
      }
      local_130._M_string_length = plVar7[1];
      *plVar7 = (long)psVar19;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      EParse::EParse(pEVar6,&local_130);
      __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
    }
  }
  else {
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::find(&t1_deps->_M_t,(key_type *)local_2f8);
    if ((_Rb_tree_header *)cVar5._M_node == &(t1_deps->_M_t)._M_impl.super__Rb_tree_header) {
      pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
      std::operator+(&local_348,"Top variable ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8)
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_150._0_8_ = *plVar7;
      pvVar14 = (pointer)(plVar7 + 2);
      if ((pointer)local_150._0_8_ == pvVar14) {
        local_150._16_8_ =
             (pvVar14->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_150._24_8_ = plVar7[3];
        local_150._0_8_ = (pointer)(local_150 + 0x10);
      }
      else {
        local_150._16_8_ =
             (pvVar14->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      }
      local_150._8_8_ = plVar7[1];
      *plVar7 = (long)pvVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      EParse::EParse(pEVar6,(string *)local_150);
      __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
    }
  }
  domainI = cVar5._M_node[2]._M_color;
  local_210._0_8_ = (pointer)(local_210 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,local_2f8._0_8_,
             (pointer)(local_2f8._0_8_ +
                      (long)(MultiAgentDecisionProcessDiscreteFactoredStates *)local_2f8._8_8_));
  local_308 = (_Base_ptr)t0_deps;
  pVar8 = GetParsedElement(local_378,(string *)local_210);
  uVar23 = (ulong)pVar8 >> 0x20;
  if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  eVar20 = pVar8.first;
  if (eVar20 == STATE) {
    this_00 = (StateFactorDiscrete *)
              (**(code **)(*(long *)&(local_378->_m_fDecPOMDP->
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 200))
                        (local_378->_m_fDecPOMDP,uVar23);
    StateFactorDiscrete::GetStateFactorValue_abi_cxx11_((string *)local_398,this_00,domainI);
    std::__cxx11::string::operator=((string *)&local_348,(string *)local_398);
    if ((ParserProbModelXML *)local_398._0_8_ == (ParserProbModelXML *)(local_398 + 0x10))
    goto LAB_00458b82;
  }
  else {
    if (eVar20 == ACTION) {
      if (local_378->_m_asynchronousModel != false) {
        std::__cxx11::string::_M_assign((string *)&local_348);
        goto LAB_00458b82;
      }
      lVar9 = (**(code **)(*(long *)&(local_378->_m_fDecPOMDP->
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0x120))
                        (local_378->_m_fDecPOMDP,uVar23,domainI);
      local_398._0_8_ = local_398 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_398,*(long *)(lVar9 + 8),
                 *(long *)(lVar9 + 0x10) + *(long *)(lVar9 + 8));
    }
    else {
      if (eVar20 != OBSERVATION) {
        pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398,"Variable ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8);
        plVar7 = (long *)std::__cxx11::string::append(local_398);
        local_170._0_8_ = *plVar7;
        pSVar17 = (pointer)(plVar7 + 2);
        if ((pointer)local_170._0_8_ == pSVar17) {
          local_170._16_8_ =
               (pSVar17->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_170._24_8_ = plVar7[3];
          local_170._0_8_ = (pointer)(local_170 + 0x10);
        }
        else {
          local_170._16_8_ =
               (pSVar17->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        local_170._8_8_ = plVar7[1];
        *plVar7 = (long)pSVar17;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        EParse::EParse(pEVar6,(string *)local_170);
        __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
      }
      lVar9 = (**(code **)(*(long *)&(local_378->_m_fDecPOMDP->
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0x178))
                        (local_378->_m_fDecPOMDP,uVar23,domainI);
      local_398._0_8_ = local_398 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_398,*(long *)(lVar9 + 8),
                 *(long *)(lVar9 + 0x10) + *(long *)(lVar9 + 8));
    }
    std::__cxx11::string::operator=((string *)&local_348,(string *)local_398);
    if ((ParserProbModelXML *)local_398._0_8_ == (ParserProbModelXML *)(local_398 + 0x10))
    goto LAB_00458b82;
  }
  operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
LAB_00458b82:
  pPVar21 = (ParserProbModelXML *)local_230;
  local_230._0_8_ = (pointer)local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)pPVar21,"Branches","");
  pxVar4 = FindChild(pPVar21,current_node,(string *)local_230);
  if ((pointer)local_230._0_8_ != (pointer)local_220) {
    operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
  }
  if (pxVar4 == (xmlNodePtr)0x0) {
    puVar13 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar13 = &PTR__E_0059bd80;
    puVar13[1] = puVar13 + 3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar13 + 1),"Incorrectly specified Tree/ADD (no branches).","");
    *puVar13 = &PTR__E_005ce150;
    __cxa_throw(puVar13,&EParse::typeinfo,E::~E);
  }
  local_300 = &t1_deps->_M_t;
  pPVar21 = (ParserProbModelXML *)xmlFirstElementChild(pxVar4);
  if (pPVar21 != (ParserProbModelXML *)0x0) {
    bVar2 = false;
    do {
      uVar1 = bVar2;
      if (*(int *)&pPVar21->_m_context == 1) {
        pPVar12 = (ParserProbModelXML *)local_250;
        local_250._0_8_ = (pointer)(local_250 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"States","");
        pPVar22 = pPVar21;
        pxVar4 = FindChild(pPVar12,(xmlNodePtr)pPVar21,(string *)local_250);
        if ((pointer)local_250._0_8_ != (pointer)(local_250 + 0x10)) {
          pPVar22 = (ParserProbModelXML *)
                    ((long)&(((SDT *)local_250._16_8_)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + 1);
          operator_delete((void *)local_250._0_8_,(ulong)pPVar22);
        }
        lVar9 = xmlChildElementCount(pxVar4);
        bVar24 = true;
        uVar1 = true;
        if (lVar9 != 0) {
          node = (_xmlNode *)xmlFirstElementChild(pxVar4);
          uVar1 = bVar2;
          while ((node != (xmlNodePtr)0x0 && (!(bool)uVar1))) {
            if (*(xmlElementType *)((long)node + 8) == XML_ELEMENT_NODE) {
              GetVariableName_abi_cxx11_((string *)local_398,pPVar22,node);
              if (local_348._M_string_length == local_398._8_8_) {
                if ((_Base_ptr)local_348._M_string_length == (_Base_ptr)0x0) {
                  uVar1 = true;
                }
                else {
                  pPVar22 = (ParserProbModelXML *)local_398._0_8_;
                  iVar3 = bcmp(local_348._M_dataplus._M_p,(void *)local_398._0_8_,
                               local_348._M_string_length);
                  if (iVar3 == 0) {
                    uVar1 = true;
                  }
                }
              }
              if ((ParserProbModelXML *)local_398._0_8_ != (ParserProbModelXML *)(local_398 + 0x10))
              {
                pPVar22 = (ParserProbModelXML *)(local_398._16_8_ + 1);
                operator_delete((void *)local_398._0_8_,(ulong)pPVar22);
              }
            }
            node = *(_xmlNode **)((long)node + 0x30);
          }
        }
        if ((bool)uVar1) {
          local_270._0_8_ = local_270 + 0x10;
          pPVar22 = (ParserProbModelXML *)local_270;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"Reference","");
          pxVar4 = FindChild(pPVar22,(xmlNodePtr)pPVar21,(string *)local_270);
          pPVar22 = local_378;
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,
                            (ulong)((long)&(((SDT *)local_270._16_8_)->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if (pxVar4 != (xmlNodePtr)0x0) {
            pcVar10 = (char *)xmlNodeListGetString(pPVar22->_m_doc,pxVar4->children,1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_398,pcVar10,(allocator<char> *)local_370);
            std::operator+(&local_328,".//Branch/Label[contains(.,\'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_398);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_328);
            pp_Var15 = (_func_int **)(plVar7 + 2);
            if ((_func_int **)*plVar7 == pp_Var15) {
              local_370._16_8_ = *pp_Var15;
              local_370._24_8_ = plVar7[3];
              local_370._0_8_ = local_370 + 0x10;
            }
            else {
              local_370._16_8_ = *pp_Var15;
              local_370._0_8_ = (_func_int **)*plVar7;
            }
            local_370._8_8_ = plVar7[1];
            *plVar7 = (long)pp_Var15;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
            pxVar11 = GetNodesMatchingExpression(pPVar22,(xmlChar *)local_370._0_8_,local_2d8);
            if (pxVar11 == (xmlXPathObjectPtr)0x0) {
              pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
              std::operator+(&local_328,"Label \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_190._0_8_ = *plVar7;
              pSVar17 = (pointer)(plVar7 + 2);
              if ((pointer)local_190._0_8_ == pSVar17) {
                local_190._16_8_ =
                     (pSVar17->super_SDT).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_190._24_8_ = plVar7[3];
                local_190._0_8_ = (pointer)(local_190 + 0x10);
              }
              else {
                local_190._16_8_ =
                     (pSVar17->super_SDT).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              local_190._8_8_ = plVar7[1];
              *plVar7 = (long)pSVar17;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              EParse::EParse(pEVar6,(string *)local_190);
              __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
            }
            if (1 < pxVar11->nodesetval->nodeNr) {
              pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
              std::operator+(&local_328,"Label \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_328);
              local_1b0._0_8_ = *plVar7;
              pFVar16 = (FactoredDecPOMDPDiscrete *)(plVar7 + 2);
              if ((FactoredDecPOMDPDiscrete *)local_1b0._0_8_ == pFVar16) {
                local_1b0._16_8_ =
                     *(undefined8 *)
                      &(pFVar16->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                       super_MultiAgentDecisionProcess;
                local_1b0._24_8_ = plVar7[3];
                local_1b0._0_8_ = (FactoredDecPOMDPDiscrete *)(local_1b0 + 0x10);
              }
              else {
                local_1b0._16_8_ =
                     *(undefined8 *)
                      &(pFVar16->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                       super_MultiAgentDecisionProcess;
              }
              local_1b0._8_8_ = plVar7[1];
              *plVar7 = (long)pFVar16;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              EParse::EParse(pEVar6,(string *)local_1b0);
              __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
            }
            pPVar21 = (ParserProbModelXML *)(*pxVar11->nodesetval->nodeTab)->parent;
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
            }
            if ((ParserProbModelXML *)local_398._0_8_ != (ParserProbModelXML *)(local_398 + 0x10)) {
              operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
            }
          }
          local_290._0_8_ = local_290 + 0x10;
          pPVar22 = (ParserProbModelXML *)local_290;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Potential","");
          pxVar4 = FindChild(pPVar22,(xmlNodePtr)pPVar21,(string *)local_290);
          if ((_Base_ptr)local_290._0_8_ != (_Base_ptr)(local_290 + 0x10)) {
            operator_delete((void *)local_290._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_290._16_8_ + 1));
          }
          bVar24 = pxVar4 == (xmlNodePtr)0x0;
          if (!bVar24) {
            pcVar10 = (char *)xmlGetProp(pxVar4,"type");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_398,pcVar10,(allocator<char> *)local_370);
            iVar3 = std::__cxx11::string::compare(local_398);
            if (iVar3 == 0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::_Rb_tree(&local_c0,
                         (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                          *)local_308);
              this_02 = &local_60;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::_Rb_tree(this_02,local_300);
              this_01 = &local_c0;
              local_350 = QueryADD(local_378,local_2d8,pxVar4,
                                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                    *)this_01,
                                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                    *)this_02);
LAB_00459113:
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::~_Rb_tree(this_02);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::~_Rb_tree(this_01);
            }
            else {
              iVar3 = std::__cxx11::string::compare(local_398);
              if (iVar3 == 0) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                ::_Rb_tree(&local_f0,
                           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                            *)local_308);
                this_02 = &local_90;
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                ::_Rb_tree(this_02,local_300);
                this_01 = &local_f0;
                local_350 = QueryTable(local_378,pxVar4,
                                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                        *)this_01,
                                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                        *)this_02);
                goto LAB_00459113;
              }
              iVar3 = std::__cxx11::string::compare(local_398);
              auVar27._8_56_ = extraout_var;
              auVar27._0_8_ = extraout_XMM0_Qa;
              auVar26 = auVar27._0_16_;
              if (iVar3 != 0) {
                pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_370,"CPD type \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_398);
                plVar7 = (long *)std::__cxx11::string::append(local_370);
                local_1d0._M_allocated_capacity = *plVar7;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d0._M_allocated_capacity == paVar18) {
                  local_1c0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_1c0._8_8_ = plVar7[3];
                  local_1d0._M_allocated_capacity = (size_type)&local_1c0;
                }
                else {
                  local_1c0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                }
                local_1d0._8_8_ = plVar7[1];
                *plVar7 = (long)paVar18;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                EParse::EParse(pEVar6,(string *)&local_1d0);
                __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
              }
              local_2b0._0_8_ = local_2b0 + 0x10;
              pPVar22 = (ParserProbModelXML *)local_2b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Variables","");
              pPVar12 = (ParserProbModelXML *)FindChild(pPVar22,pxVar4,(string *)local_2b0);
              local_2d0._0_8_ = local_2d0 + 0x10;
              pPVar22 = (ParserProbModelXML *)local_2d0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"Variable","");
              pxVar4 = FindChild(pPVar22,(xmlNodePtr)pPVar12,(string *)local_2d0);
              if ((_Base_ptr)local_2d0._0_8_ != (_Base_ptr)(local_2d0 + 0x10)) {
                pPVar12 = (ParserProbModelXML *)((long)(_Rb_tree_color *)local_2d0._16_8_ + 1);
                operator_delete((void *)local_2d0._0_8_,(ulong)pPVar12);
              }
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                pPVar12 = (ParserProbModelXML *)((long)(_Rb_tree_color *)local_2b0._16_8_ + 1);
                operator_delete((void *)local_2b0._0_8_,(ulong)pPVar12);
              }
              pPVar22 = (ParserProbModelXML *)local_370;
              GetVariableName_abi_cxx11_((string *)pPVar22,pPVar12,pxVar4);
              iVar3 = GetVariableTimeslice(pPVar22,pxVar4);
              if (iVar3 == 0) {
                cVar5 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)local_308,(key_type *)local_370);
              }
              else {
                cVar5 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                        ::find(local_300,(key_type *)local_370);
              }
              auVar26 = vcvtusi2ss_avx512f(auVar26,*(undefined4 *)&cVar5._M_node[2].field_0x4);
              fVar25 = auVar26._0_4_;
              if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                local_350 = (double)CONCAT44(local_350._4_4_,auVar26._0_4_);
                operator_delete((void *)local_370._0_8_,(ulong)(local_370._16_8_ + 1));
                fVar25 = local_350._0_4_;
              }
              local_350 = 1.0 / (double)fVar25;
            }
            if ((ParserProbModelXML *)local_398._0_8_ != (ParserProbModelXML *)(local_398 + 0x10)) {
              operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
            }
          }
        }
        if (!bVar24) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,
                            CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                                     local_348.field_2._M_local_buf[0]) + 1);
          }
          if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
            operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
          }
          return local_350;
        }
      }
      pPVar21 = (ParserProbModelXML *)
                (pPVar21->_m_parsedElements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    } while ((pPVar21 != (ParserProbModelXML *)0x0) && (bVar2 = (bool)uVar1, !(bool)uVar1));
  }
  pEVar6 = (EParse *)__cxa_allocate_exception(0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                 "Probability under top variable ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
  plVar7 = (long *)std::__cxx11::string::append(local_398);
  local_1f0._0_8_ = *plVar7;
  pFVar16 = (FactoredDecPOMDPDiscrete *)(plVar7 + 2);
  if ((FactoredDecPOMDPDiscrete *)local_1f0._0_8_ == pFVar16) {
    local_1f0._16_8_ =
         *(undefined8 *)
          &(pFVar16->super_MultiAgentDecisionProcessDiscreteFactoredStates).
           super_MultiAgentDecisionProcess;
    local_1f0._24_8_ = plVar7[3];
    local_1f0._0_8_ = (FactoredDecPOMDPDiscrete *)(local_1f0 + 0x10);
  }
  else {
    local_1f0._16_8_ =
         *(undefined8 *)
          &(pFVar16->super_MultiAgentDecisionProcessDiscreteFactoredStates).
           super_MultiAgentDecisionProcess;
  }
  local_1f0._8_8_ = plVar7[1];
  *plVar7 = (long)pFVar16;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  EParse::EParse(pEVar6,(string *)local_1f0);
  __cxa_throw(pEVar6,&EParse::typeinfo,E::~E);
}

Assistant:

double ParserProbModelXML::QueryADD(const xmlNodePtr root_node,
                                    const xmlNodePtr current_node,
                                    const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                    const std::map<std::string, std::pair<Index, Index> > t1_deps)
{
    //find top variable
    xmlNodePtr top = FindChild(current_node, "TopVariable");
    if(top == NULL)
        throw EParse("Incorrectly specified Tree/ADD (no top variable).");
   
    string top_name = GetVariableName(top);
    int timeslice = GetVariableTimeslice(top);    
    
    map<string, pair<Index, Index> >::const_iterator it;
    if(timeslice == 0){ 
        it = t0_deps.find(top_name);
        if(it == t0_deps.end())
        {
            throw EParse("Top variable " + top_name + " not present in dependencies.");
        }
    }
    else
    {
        it = t1_deps.find(top_name);
        if(it == t1_deps.end())
        {
            throw EParse("Top variable " + top_name + " not present in dependencies.");
        }
    }

    Index value = it->second.first; //the (integer) value of the requested top variable
    std::pair<elm_type, Index> elm = GetParsedElement(top_name);
    string value_name;
    switch(elm.first)
    {
    case STATE:
        value_name = _m_fDecPOMDP->GetStateFactorDiscrete(elm.second)->GetStateFactorValue(value);
        break;
    case ACTION:
        if(!_m_asynchronousModel)
            value_name = _m_fDecPOMDP->GetAction(elm.second, value)->GetName();
        else
            value_name = _m_ANames[elm.second][value];
        break;
    case OBSERVATION:
        value_name = _m_fDecPOMDP->GetObservation(elm.second, value)->GetName();
        break;
    default:
        throw EParse("Variable " + top_name + " has unrecognized dependencies.");
        break;
    }
    xmlNodePtr branch_set = FindChild(current_node, "Branches");
    if(branch_set == NULL)
        throw EParse("Incorrectly specified Tree/ADD (no branches).");

    xmlNodePtr branch = xmlFirstElementChild(branch_set);
    bool found_branch = false;
    while(branch != NULL && !found_branch)
    {
        if(branch->type == XML_ELEMENT_NODE)
        {
            xmlNodePtr states = FindChild(branch, "States");
            if(xmlChildElementCount(states) == 0)
            {
                found_branch = true;
            }
            else
            {
                xmlNodePtr var_state = xmlFirstElementChild(states);
                while(var_state != NULL && !found_branch)
                {
                    if(var_state->type == XML_ELEMENT_NODE)
                    {
                        string var_name = GetVariableName(var_state);
                        if(value_name == var_name)
                        {
                            found_branch = true;
                        }
                    }
                    var_state = var_state->next;
                }
            }
            if(found_branch)
            {
                //Check if it is a reference to another branch
                xmlNodePtr reference = FindChild(branch, "Reference");
                if(reference != NULL)
                {
                    string ref_name((char*) xmlNodeListGetString(GetDoc(), reference->xmlChildrenNode, 1));
                    string xpath_str = ".//Branch/Label[contains(.,'"+ref_name+"')]";
                    xmlXPathObjectPtr label_nodes = GetNodesMatchingExpression((xmlChar*) xpath_str.c_str(),root_node);                    
                    if(label_nodes == NULL)
                    {
                        throw EParse("Label \"" + ref_name + "\" not found.");
                    }
                    else if(label_nodes->nodesetval->nodeNr > 1)
                    {
                        throw EParse("Label \"" + ref_name + "\" defined multiple times.");
                    }
                    branch = label_nodes->nodesetval->nodeTab[0]->parent;
                }
                
                xmlNodePtr potential = FindChild(branch, "Potential");
                if(potential != NULL)
                {
                    string CPD_type = (char*) xmlGetProp(potential, (xmlChar*) "type");
                    if(CPD_type == "Tree/ADD")
                    {
                        return QueryADD(root_node, potential, t0_deps, t1_deps);
                    }
                    else if(CPD_type == "Table")
                    {
                        return QueryTable(potential, t0_deps, t1_deps);
                    }
                    else if(CPD_type == "Uniform")
                    {
                        map<string, pair<Index, Index> >::const_iterator it;
                        xmlNodePtr dep_var = FindChild(FindChild(potential, "Variables"), "Variable");
                        string dep_var_name = GetVariableName(dep_var);
                        int dep_var_time = GetVariableTimeslice(dep_var);
                        if(dep_var_time == 0)
                        {
                            it = t0_deps.find(dep_var_name);
                        }
                        else
                        {
                            it = t1_deps.find(dep_var_name);
                        }
                        return 1.0/(float) it->second.second;
                    }
                    else
                    {
                        throw EParse("CPD type \"" + CPD_type + "\" not supported.");
                    }
                }
            }
        }
        branch = branch->next;
    }

    throw EParse("Probability under top variable " + top_name + " not found.");
}